

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::smul_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  APInt AVar3;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  operator*(this,RHS);
  bVar1 = operator==(RHS,0);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    bVar1 = operator==((APInt *)Overflow,0);
    uVar2 = extraout_RDX_00;
    if (!bVar1) {
      sdiv((APInt *)&local_48,this);
      bVar1 = operator==((APInt *)&local_48,RHS);
      if (bVar1) {
        sdiv((APInt *)&local_38,this);
        bVar1 = operator==((APInt *)&local_38,(APInt *)Overflow);
        *in_RCX = !bVar1;
        uVar2 = extraout_RDX_02;
        if ((0x40 < local_30) && ((void *)local_38.VAL != (void *)0x0)) {
          operator_delete__(local_38.pVal);
          uVar2 = extraout_RDX_03;
        }
      }
      else {
        *in_RCX = 1;
        uVar2 = extraout_RDX_01;
      }
      if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
        operator_delete__(local_48.pVal);
        uVar2 = extraout_RDX_04;
      }
      goto LAB_0017c5d2;
    }
  }
  *in_RCX = 0;
LAB_0017c5d2:
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::smul_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this * RHS;

  if (*this != 0 && RHS != 0)
    Overflow = Res.sdiv(RHS) != *this || Res.sdiv(*this) != RHS;
  else
    Overflow = false;
  return Res;
}